

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::Read(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       *this,BinaryReader<mp::internal::EndiannessConverter> *bound_reader)

{
  NLHeader *pNVar1;
  BinaryReader<mp::internal::EndiannessConverter> *pBVar2;
  byte *pbVar3;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *pNVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  byte bVar8;
  Type type;
  uint info;
  int iVar9;
  int iVar10;
  int iVar11;
  LogicalExpr LVar12;
  LinearExprHandler linear_expr;
  NumericExpr NVar13;
  bool bVar14;
  bool bVar15;
  StringRef name;
  BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_> local_58;
  ArgList local_48;
  BinaryReader<mp::internal::EndiannessConverter> *local_38;
  
  bVar14 = bound_reader == (BinaryReader<mp::internal::EndiannessConverter> *)0x0;
  pNVar1 = this->header_;
  this->num_vars_and_exprs_ =
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_objs +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
  local_38 = bound_reader;
  do {
    pBVar2 = this->reader_;
    pbVar3 = (byte *)(pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = (char *)pbVar3;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = (char *)(pbVar3 + 1);
    bVar8 = *pbVar3;
    if (0x61 < bVar8) {
      if (bVar8 < 0x6b) {
        if (bVar8 == 0x62) {
          if (bVar14 == false) {
            if (local_38 == (BinaryReader<mp::internal::EndiannessConverter> *)0x0) {
              local_58.problem_ = (BasicProblem<mp::BasicProblemParams<int>_> *)0x0;
              local_58.index_ = 0;
              local_58._12_4_ = 0;
              local_48.types_ = 0;
              local_48.field_1.values_ = (Value *)&local_58;
              BinaryReaderBase::ReportError
                        (&pBVar2->super_BinaryReaderBase,(CStringRef)0x391fb7,&local_48);
            }
            pBVar2 = this->reader_;
            pcVar5 = (local_38->super_BinaryReaderBase).super_ReaderBase.ptr_;
            pcVar6 = (local_38->super_BinaryReaderBase).super_ReaderBase.start_;
            pcVar7 = (local_38->super_BinaryReaderBase).super_ReaderBase.token_;
            (pBVar2->super_BinaryReaderBase).super_ReaderBase.end_ =
                 (local_38->super_BinaryReaderBase).super_ReaderBase.end_;
            (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar7;
            (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5;
            (pBVar2->super_BinaryReaderBase).super_ReaderBase.start_ = pcVar6;
            std::__cxx11::string::_M_assign
                      ((string *)&(pBVar2->super_BinaryReaderBase).super_ReaderBase.name_);
            bVar15 = true;
            local_38 = (BinaryReader<mp::internal::EndiannessConverter> *)0x0;
          }
          else {
            NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
            ::
            ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::VarHandler>
                      ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                        *)this);
            bVar8 = (byte)this->flags_ & 1;
            bVar15 = bVar8 == 0;
            bVar14 = (bool)(bVar14 & -bVar8);
          }
          goto LAB_0033f13b;
        }
        if (bVar8 != 100) goto switchD_0033ecc7_caseD_44;
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::AlgebraicConHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                    *)this);
      }
      else if (bVar8 == 0x6b) {
        ReadColumnSizes<true>(this);
      }
      else if (bVar8 == 0x72) {
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::AlgebraicConHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                    *)this);
      }
      else {
        if (bVar8 != 0x78) goto switchD_0033ecc7_caseD_44;
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::VarHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                    *)this);
      }
      goto LAB_0033f139;
    }
    switch(bVar8) {
    case 0x43:
      iVar9 = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.
                            num_algebraic_cons);
      pBVar2 = this->reader_;
      pNVar4 = this->handler_;
      pcVar5 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
      NVar13 = ReadNumericExpr(this,*pcVar5,true);
      NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnAlgebraicCon
                (pNVar4,iVar9,(NumericExpr)NVar13.super_ExprBase.impl_);
      break;
    case 0x44:
    case 0x45:
    case 0x48:
    case 0x49:
    case 0x4d:
    case 0x4e:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x54:
    case 0x55:
switchD_0033ecc7_caseD_44:
      local_58.problem_ = (BasicProblem<mp::BasicProblemParams<int>_> *)0x0;
      local_58.index_ = 0;
      local_58._12_4_ = 0;
      local_48.types_ = 0;
      local_48.field_1.values_ = (Value *)&local_58;
      BinaryReaderBase::ReportError(&pBVar2->super_BinaryReaderBase,(CStringRef)0x391fe1,&local_48);
      break;
    case 0x46:
      iVar9 = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs);
      type = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
      if (SYMBOLIC < type) {
        local_58.problem_ = (BasicProblem<mp::BasicProblemParams<int>_> *)0x0;
        local_58.index_ = 0;
        local_58._12_4_ = 0;
        local_48.types_ = 0;
        local_48.field_1.values_ = (Value *)&local_58;
        BinaryReaderBase::ReportError
                  (&this->reader_->super_BinaryReaderBase,(CStringRef)0x391f8d,&local_48);
      }
      iVar10 = BinaryReader<mp::internal::EndiannessConverter>::ReadInt<int>(this->reader_);
      name = BinaryReader<mp::internal::EndiannessConverter>::ReadString(this->reader_);
      BasicExprFactory<std::allocator<char>_>::DefineFunction
                (&this->handler_->builder_->super_ExprFactory,iVar9,name,iVar10,type);
      break;
    case 0x47:
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
      ::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::ObjHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                  *)this);
      break;
    case 0x4a:
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
      ::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::AlgebraicConHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                  *)this);
      break;
    case 0x4b:
      ReadColumnSizes<false>(this);
      break;
    case 0x4c:
      iVar9 = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.
                            num_logical_cons);
      pNVar4 = this->handler_;
      LVar12 = ReadLogicalExpr(this);
      BasicProblem<mp::BasicProblemParams<int>_>::MutLogicalCon::MutLogicalCon
                ((MutLogicalCon *)&local_58,pNVar4->builder_,iVar9);
      ((local_58.problem_)->logical_cons_).
      super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
      ._M_impl.super__Vector_impl_data._M_start[local_58.index_].super_ExprBase.impl_ =
           (Impl *)LVar12.super_ExprBase.impl_;
      break;
    case 0x4f:
      iVar9 = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_objs);
      iVar10 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
      pBVar2 = this->reader_;
      pcVar5 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
      NVar13 = ReadNumericExpr(this,*pcVar5,true);
      pNVar4 = this->handler_;
      iVar11 = (*pNVar4->_vptr_NLProblemBuilder[3])(pNVar4);
      if (((char)iVar11 != '\0') ||
         (iVar11 = (*pNVar4->_vptr_NLProblemBuilder[2])(pNVar4), iVar11 + -1 == iVar9)) {
        pNVar4 = this->handler_;
        iVar11 = (*pNVar4->_vptr_NLProblemBuilder[3])(pNVar4);
        if ((char)iVar11 == '\0') {
          iVar9 = 0;
        }
        NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnObj
                  (pNVar4,iVar9,(uint)(iVar10 != 0),(NumericExpr)NVar13.super_ExprBase.impl_);
      }
      goto LAB_0033f032;
    case 0x53:
      info = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(pBVar2);
      if (7 < (int)info) {
        local_58.problem_ = (BasicProblem<mp::BasicProblemParams<int>_> *)0x0;
        local_58.index_ = 0;
        local_58._12_4_ = 0;
        local_48.types_ = 0;
        local_48.field_1.values_ = (Value *)&local_58;
        BinaryReaderBase::ReportError
                  (&this->reader_->super_BinaryReaderBase,(CStringRef)0x391fa3,&local_48);
      }
      switch(info & 3) {
      case 0:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::VarHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                    *)this,info);
        break;
      case 1:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::ConHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                    *)this,info);
        break;
      case 2:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::ObjHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                    *)this,info);
        break;
      case 3:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::ProblemHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                    *)this,info);
      }
      break;
    case 0x56:
      iVar9 = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars,
                       this->num_vars_and_exprs_);
      iVar9 = iVar9 - (this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
      iVar10 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
      iVar11 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
      linear_expr = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::
                    BeginCommonExpr(this->handler_,iVar9,iVar10);
      if (iVar10 != 0) {
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::ReadLinearExpr<mp::BasicProblem<mp::BasicProblemParams<int>>::LinearExprBuilder>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                    *)this,iVar10,(LinearExprBuilder)linear_expr.expr_);
      }
      pBVar2 = this->reader_;
      pNVar4 = this->handler_;
      pcVar5 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
      NVar13 = ReadNumericExpr(this,*pcVar5,false);
      BasicProblem<mp::BasicProblemParams<int>_>::MutCommonExpr::MutCommonExpr
                ((MutCommonExpr *)&local_58,pNVar4->builder_,iVar9);
      ((local_58.problem_)->nonlinear_exprs_).
      super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
      ._M_impl.super__Vector_impl_data._M_start[local_58.index_].super_ExprBase.impl_ =
           (Impl *)NVar13.super_ExprBase.impl_;
      BasicProblem<mp::BasicProblemParams<int>_>::MutCommonExpr::set_position
                ((MutCommonExpr *)&local_58,iVar11);
LAB_0033f032:
      bVar15 = true;
      goto LAB_0033f13b;
    default:
      if ((bVar8 != 0) || ((byte *)(pBVar2->super_BinaryReaderBase).super_ReaderBase.end_ != pbVar3)
         ) goto switchD_0033ecc7_caseD_44;
      if (bVar14 != false) {
        local_58.problem_ = (BasicProblem<mp::BasicProblemParams<int>_> *)0x0;
        local_58.index_ = 0;
        local_58._12_4_ = 0;
        local_48.types_ = 0;
        local_48.field_1.values_ = (Value *)&local_58;
        BinaryReaderBase::ReportError
                  (&pBVar2->super_BinaryReaderBase,(CStringRef)0x391fcd,&local_48);
      }
      bVar15 = false;
      goto LAB_0033f13b;
    }
LAB_0033f139:
    bVar15 = true;
LAB_0033f13b:
    if (!bVar15) {
      return;
    }
  } while( true );
}

Assistant:

void NLReader<Reader, Handler>::Read(Reader *bound_reader) {
  bool read_bounds = bound_reader == 0;
  // TextReader::ReadHeader checks that this doesn't overflow.
  num_vars_and_exprs_ = header_.num_vars +
      header_.num_common_exprs_in_both +
      header_.num_common_exprs_in_cons +
      header_.num_common_exprs_in_objs +
      header_.num_common_exprs_in_single_cons +
      header_.num_common_exprs_in_single_objs;
  for (;;) {
    char c = reader_.ReadChar();
    switch (c) {
    case 'C': {
      // Nonlinear part of an algebraic constraint body.
      int index = ReadUInt(header_.num_algebraic_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnAlgebraicCon(index, ReadNumericExpr(true));
      break;
    }
    case 'L': {
      // Logical constraint expression.
      int index = ReadUInt(header_.num_logical_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnLogicalCon(index, ReadLogicalExpr());
      break;
    }
    case 'O': {
      // Objective type and nonlinear part of an objective expression.
      int index = ReadUInt(header_.num_objs);
      int obj_type = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      NumericExpr expr = ReadNumericExpr(true);
      if (handler_.NeedObj(index))
        handler_.OnObj(handler_.resulting_obj_index(index),
                       obj_type != 0 ? obj::MAX : obj::MIN,
                       expr);
      break;
    }
    case 'V': {
      // Defined variable definition (must precede V, C, L, O segments
      // where used).
      int expr_index = ReadUInt(header_.num_vars, num_vars_and_exprs_);
      expr_index -= header_.num_vars;
      int num_linear_terms = reader_.ReadUInt();
      int position = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      typename Handler::LinearExprHandler
          expr_handler(handler_.BeginCommonExpr(expr_index, num_linear_terms));
      if (num_linear_terms != 0)
        ReadLinearExpr(num_linear_terms, expr_handler);
      handler_.EndCommonExpr(expr_index, ReadNumericExpr(), position);
      break;
    }
    case 'F': {
      // Imported function description.
      int index = ReadUInt(header_.num_funcs);
      int type = reader_.ReadUInt();
      if (type != func::NUMERIC && type != func::SYMBOLIC)
        reader_.ReportError("invalid function type");
      int num_args = reader_.template ReadInt<int>();
      fmt::StringRef name = reader_.ReadName();
      reader_.ReadTillEndOfLine();
      handler_.OnFunction(index, name, num_args, static_cast<func::Type>(type));
      break;
    }
    case 'G':
      // Linear part of an objective expression & gradient sparsity.
      ReadLinearExpr<ObjHandler>();
      break;
    case 'J':
      // Jacobian sparsity & linear terms in constraints.
      ReadLinearExpr<AlgebraicConHandler>();
      break;
    case 'S': {
      // Suffix values.
      int info = reader_.ReadUInt();
      if (info > (internal::SUFFIX_KIND_MASK | suf::FLOAT))
        reader_.ReportError("invalid suffix kind");
      switch (info & internal::SUFFIX_KIND_MASK) {
      case suf::VAR:
        ReadSuffix<VarHandler>(info);
        break;
      case suf::CON:
        ReadSuffix<ConHandler>(info);
        break;
      case suf::OBJ:
        ReadSuffix<ObjHandler>(info);
        break;
      case suf::PROBLEM:
        ReadSuffix<ProblemHandler>(info);
        break;
      }
      break;
    }
    case 'b':
      // Bounds on variables.
      if (read_bounds) {
        ReadBounds<VarHandler>();
        reader_.ptr();
        if ((flags_ & READ_BOUNDS_FIRST) != 0)
          return;
        read_bounds = false;
        break;
      }
      if (!bound_reader)
        reader_.ReportError("duplicate 'b' segment");
      reader_ = *bound_reader;
      bound_reader = 0;
      break;
    case 'r':
      // Bounds on algebraic constraint bodies ("ranges").
      ReadBounds<AlgebraicConHandler>();
      break;
    case 'K':
      // Jacobian sparsity & linear constraint term matrix column sizes
      // (must precede all J segments).
      ReadColumnSizes<false>();
      break;
    case 'k':
      // Jacobian sparsity & linear constraint term matrix cumulative column
      // sizes (must precede all J segments).
      ReadColumnSizes<true>();
      break;
    case 'x':
      // Primal initial guess.
      ReadInitialValues<VarHandler>();
      break;
    case 'd':
      // Dual initial guess.
      ReadInitialValues<AlgebraicConHandler>();
      break;
    case '\0':
      if (reader_.IsEOF()) {
        if (read_bounds)
          reader_.ReportError("segment 'b' missing");
        return;
      }
      // Fall through.
    default:
      reader_.ReportError("invalid segment type");
    }
  }
}